

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayReverseMethod::ArrayReverseMethod(ArrayReverseMethod *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Reverse,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005ef968;
  return;
}

Assistant:

ArrayReverseMethod() : SystemSubroutine(KnownSystemName::Reverse, SubroutineKind::Function) {}